

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclBackend.cpp
# Opt level: O3

void __thiscall xmrig::OclBackend::stop(OclBackend *this)

{
  long lVar1;
  long lVar2;
  
  if ((this->d_ptr->threads).
      super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->d_ptr->threads).
      super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    lVar1 = std::chrono::_V2::steady_clock::now();
    lVar2 = SUB168(SEXT816(lVar1) * SEXT816(-0x431bde82d7b634db),8);
    Workers<xmrig::OclLaunchData>::stop(&this->d_ptr->workers);
    std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>::_M_erase_at_end
              (&this->d_ptr->threads,
               (this->d_ptr->threads).
               super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>.
               _M_impl.super__Vector_impl_data._M_start);
    OclSharedState::release();
    lVar1 = std::chrono::_V2::steady_clock::now();
    Log::print(INFO,"%s\x1b[0;33m stopped\x1b[0m\x1b[1;30m (%lu ms)\x1b[0m",
               "\x1b[45;1m\x1b[1;37m ocl \x1b[0m",
               lVar1 / 1000000 + ((lVar2 >> 0x12) - (lVar2 >> 0x3f)));
    return;
  }
  return;
}

Assistant:

void xmrig::OclBackend::stop()
{
    if (d_ptr->threads.empty()) {
        return;
    }

    const uint64_t ts = Chrono::steadyMSecs();

    d_ptr->workers.stop();
    d_ptr->threads.clear();

    OclSharedState::release();

    LOG_INFO("%s" YELLOW(" stopped") BLACK_BOLD(" (%" PRIu64 " ms)"), tag, Chrono::steadyMSecs() - ts);
}